

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svg2png.cpp
# Opt level: O3

bool setup(int argc,char **argv,string *filename,uint32_t *width,uint32_t *height,uint32_t *bgColor)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  stringstream ss;
  long local_1b8 [2];
  long local_1a8;
  uint auStack_1a0 [2];
  byte abStack_198 [8];
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  if (1 < argc) {
    pcVar1 = argv[1];
    pcVar2 = (char *)filename->_M_string_length;
    strlen(pcVar1);
    std::__cxx11::string::_M_replace((ulong)filename,0,pcVar2,(ulong)pcVar1);
    if (argc == 2) {
      return true;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    pcVar1 = argv[2];
    iVar3 = (int)(ostream *)&local_1a8;
    if (pcVar1 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(local_1a8 + -0x18) + iVar3);
    }
    else {
      sVar5 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar1,sVar5);
    }
    std::istream::_M_extract<unsigned_int>((uint *)local_1b8);
    if (((abStack_198[*(long *)(local_1b8[0] + -0x18)] & 5) == 0) &&
       (iVar4 = std::istream::get(), iVar4 == 0x78)) {
      std::istream::_M_extract<unsigned_int>((uint *)local_1b8);
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
      if ((uint)argc < 4) {
        return true;
      }
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) =
           *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) & 0xffffffb5 | 8;
      pcVar1 = argv[3];
      if (pcVar1 == (char *)0x0) {
        std::ios::clear(iVar3 + (int)*(undefined8 *)(local_1a8 + -0x18));
      }
      else {
        sVar5 = strlen(pcVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar1,sVar5);
      }
      *(uint *)((long)auStack_1a0 + *(long *)(local_1b8[0] + -0x18)) =
           *(uint *)((long)auStack_1a0 + *(long *)(local_1b8[0] + -0x18)) & 0xffffffb5 | 8;
      std::istream::_M_extract<unsigned_int>((uint *)local_1b8);
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
      return true;
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  return false;
}

Assistant:

bool setup(int argc, char** argv, std::string& filename, std::uint32_t& width, std::uint32_t& height, std::uint32_t& bgColor)
{
    if(argc > 1) filename.assign(argv[1]);
    if(argc > 2) {
        std::stringstream ss;
        ss << argv[2];
        ss >> width;

        if(ss.fail() || ss.get() != 'x')
            return false;
        ss >> height;
    }

    if(argc > 3) {
        std::stringstream ss;
        ss << std::hex << argv[3];
        ss >> std::hex >> bgColor;
    }

    return argc > 1;
}